

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_11::NameApplier::OnBrTableExpr(NameApplier *this,BrTableExpr *expr)

{
  pointer pVVar1;
  Var *in_RCX;
  Var *target;
  pointer var;
  string_view sVar2;
  string_view name;
  string_view name_00;
  
  pVVar1 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (var = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
             super__Vector_impl_data._M_start; var != pVVar1; var = var + 1) {
    sVar2 = FindLabelByVar(this,var);
    name._M_str = (char *)var;
    name._M_len = (size_t)sVar2._M_str;
    UseNameForVar((NameApplier *)sVar2._M_len,name,in_RCX);
  }
  sVar2 = FindLabelByVar(this,&expr->default_target);
  name_00._M_str = (char *)&expr->default_target;
  name_00._M_len = (size_t)sVar2._M_str;
  UseNameForVar((NameApplier *)sVar2._M_len,name_00,in_RCX);
  return (Result)Ok;
}

Assistant:

Result NameApplier::OnBrTableExpr(BrTableExpr* expr) {
  for (Var& target : expr->targets) {
    std::string_view label = FindLabelByVar(&target);
    UseNameForVar(label, &target);
  }

  std::string_view label = FindLabelByVar(&expr->default_target);
  UseNameForVar(label, &expr->default_target);
  return Result::Ok;
}